

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::HeapType::getReferencedHeapTypes
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          HeapType *this)

{
  optional<wasm::HeapType> oVar1;
  _Storage<wasm::HeapType,_true> local_28;
  optional<wasm::HeapType> super;
  
  getHeapTypeChildren(__return_storage_ptr__,this);
  oVar1 = getDeclaredSuperType(this);
  local_28 = oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (__return_storage_ptr__,&local_28._M_value);
  }
  oVar1 = getDescriptorType(this);
  local_28 = oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (__return_storage_ptr__,&local_28._M_value);
  }
  oVar1 = getDescribedType(this);
  local_28 = oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (__return_storage_ptr__,&local_28._M_value);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> HeapType::getReferencedHeapTypes() const {
  auto types = getHeapTypeChildren();
  if (auto super = getDeclaredSuperType()) {
    types.push_back(*super);
  }
  if (auto desc = getDescriptorType()) {
    types.push_back(*desc);
  }
  if (auto desc = getDescribedType()) {
    types.push_back(*desc);
  }
  return types;
}